

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O3

Vector __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::measureDynamics
          (IMUElasticLocalFrameDynamicalSystem *this,Vector *x,Vector *u,uint k)

{
  AlgebraicSensor *this_00;
  Index *pIVar1;
  Index *pIVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Index *pIVar5;
  double dVar6;
  double dVar7;
  DenseStorage<double,__1,__1,_1,_0> DVar8;
  void *__ptr;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double dVar18;
  double dVar19;
  undefined8 uVar20;
  Index IVar21;
  Index IVar22;
  Index IVar23;
  undefined1 auVar24 [16];
  bool bVar25;
  char cVar26;
  uint uVar27;
  PointerType ptr;
  DenseStorage<double,__1,__1,__1,_0> *this_01;
  reference pMVar28;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar29;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_02;
  undefined4 in_register_0000000c;
  long *plVar30;
  double *pdVar31;
  double *pdVar32;
  long lVar33;
  ulong uVar34;
  char *pcVar35;
  uint uVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  Index extraout_RDX;
  Index size;
  bool bVar40;
  ulong uVar41;
  uint in_R8D;
  ulong uVar42;
  Index index_2;
  ulong uVar43;
  int iVar44;
  ulong uVar45;
  ActualDstType actualDst;
  ActualDstType actualDst_3;
  undefined1 auVar46 [16];
  double *pdVar47;
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double *pdVar55;
  double dVar56;
  Vector VVar57;
  double local_2c8;
  double *local_2b8;
  double dStack_2b0;
  double local_2a8;
  type tmp;
  ActualDstType actualDst_2;
  Index *local_188;
  Vector *local_180;
  Scalar local_178;
  double *pdStack_170;
  double local_168;
  double local_160;
  undefined8 uStack_158;
  double *local_150;
  double dStack_148;
  double local_140;
  double local_138 [2];
  Scalar local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Vector6 local_98;
  Vector6 local_68;
  
  plVar30 = (long *)CONCAT44(in_register_0000000c,k);
  cVar26 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[8])(x,u);
  if (cVar26 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x42,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  cVar26 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[9])(x);
  if (cVar26 == '\0') {
    __assert_fail("checkInputvector(v) && \"ERROR: The input vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x47,
                  "void stateObservation::DynamicalSystemFunctorBase::assertInputVector_(const Vector &)"
                 );
  }
  pIVar1 = &x[0x1a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar32 = (double *)
            (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      pdVar32) {
    if ((long)pdVar32 < 0) goto LAB_0016018e;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)pIVar1,(Index)pdVar32,(Index)pdVar32,1);
    if (x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        pdVar32) goto LAB_001601ad;
  }
  lVar33 = *pIVar1;
  pdVar31 = (double *)((long)pdVar32 - ((long)pdVar32 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pdVar32) {
    lVar37 = 0;
    do {
      pdVar15 = pdVar47 + lVar37;
      dVar52 = pdVar15[1];
      pdVar16 = (double *)(lVar33 + lVar37 * 8);
      *pdVar16 = *pdVar15;
      pdVar16[1] = dVar52;
      lVar37 = lVar37 + 2;
    } while (lVar37 < (long)pdVar31);
  }
  if ((long)pdVar31 < (long)pdVar32) {
    do {
      *(double *)(lVar33 + (long)pdVar31 * 8) = pdVar47[(long)pdVar31];
      pdVar31 = (double *)((long)pdVar31 + 1);
    } while (pdVar32 != pdVar31);
  }
  pIVar1 = &x[0x1c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  lVar33 = *plVar30;
  pdVar47 = (double *)plVar30[1];
  if (x[0x1d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      pdVar47) {
    if ((long)pdVar47 < 0) {
LAB_0016018e:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)pIVar1,(Index)pdVar47,(Index)pdVar47,1);
    if (x[0x1d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        pdVar47) {
LAB_001601ad:
      pcVar35 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_00160082:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar35);
    }
  }
  lVar37 = *pIVar1;
  pdVar32 = (double *)((long)pdVar47 - ((long)pdVar47 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pdVar47) {
    lVar38 = 0;
    do {
      puVar3 = (undefined8 *)(lVar33 + lVar38 * 8);
      uVar20 = puVar3[1];
      puVar4 = (undefined8 *)(lVar37 + lVar38 * 8);
      *puVar4 = *puVar3;
      puVar4[1] = uVar20;
      lVar38 = lVar38 + 2;
    } while (lVar38 < (long)pdVar32);
  }
  if ((long)pdVar32 < (long)pdVar47) {
    do {
      *(undefined8 *)(lVar37 + (long)pdVar32 * 8) = *(undefined8 *)(lVar33 + (long)pdVar32 * 8);
      pdVar32 = (double *)((long)pdVar32 + 1);
    } while (pdVar47 != pdVar32);
  }
  *(uint *)&x[0x6f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = in_R8D;
  if (2 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar52 = pdVar47[1];
    x[0x4a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)*pdVar47;
    x[0x4a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)dVar52;
    x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)pdVar47[2];
    if (8 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar32 = (double *)pdVar47[7];
      x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)pdVar47[6];
      x[0x4c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar32;
      x[0x4c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)pdVar47[8];
      if (5 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        pdVar32 = (double *)pdVar47[4];
        x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)pdVar47[3];
        x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar32;
        x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)pdVar47[5];
        if (0xb < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
          local_180 = x + 0x4a;
          local_188 = &x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
          pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          dVar52 = pdVar47[10];
          x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)pdVar47[9];
          x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               (Index)dVar52;
          x[0x51].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)pdVar47[0xb];
          pIVar1 = &x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows;
          uVar41 = 0;
          bVar25 = true;
          do {
            bVar40 = bVar25;
            if ((u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                + -6 < (long)(uVar41 * 6 + 0xc)) goto LAB_00160035;
            pdVar47 = x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
            lVar33 = (x[0xc3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows >> 3) * -0x5555555555555555 +
                     (x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      (long)x[0xc5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data >> 3) * -0x5555555555555555 +
                     (((long)pdVar47 -
                       (long)x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data >> 3) + -1 + (ulong)(pdVar47 == (double *)0x0)) * 0x15
            ;
            if (lVar33 == 0) goto LAB_0015ffaa;
            uVar27 = *(uint *)&x[0xc1].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
            if ((uVar41 < uVar27) || (lVar33 + (ulong)uVar27 <= uVar41)) goto LAB_0015ffaa;
            pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data;
            this_01 = (DenseStorage<double,__1,__1,__1,_0> *)
                      std::
                      _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                      ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                    *)pIVar1,(ulong)((int)uVar41 - uVar27));
            if (((this_01->m_rows != 6) || (this_01->m_cols != 1)) &&
               ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(this_01,6,6,1),
                this_01->m_rows != 6 || (this_01->m_cols != 1)))) {
              pcVar35 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, T1 = double, T2 = double]"
              ;
              goto LAB_00160082;
            }
            pdVar32 = this_01->m_data;
            uVar34 = 0xfffffffffffffffe;
            do {
              pdVar31 = pdVar47 + uVar41 * 6 + uVar34 + 0xe;
              dVar52 = pdVar31[1];
              pdVar32[uVar34 + 2] = *pdVar31;
              (pdVar32 + uVar34 + 2)[1] = dVar52;
              uVar34 = uVar34 + 2;
            } while (uVar34 < 4);
            uVar41 = 1;
            bVar25 = false;
          } while (bVar40);
          if (0x1a < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_rows) {
            pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data;
            dVar52 = pdVar47[0x19];
            x[0xcb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 = (double *)pdVar47[0x18];
            x[0xcb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 = (Index)dVar52;
            x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 = (double *)pdVar47[0x1a];
            if (0x1d < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_rows) {
              pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              pdVar32 = (double *)pdVar47[0x1c];
              x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)pdVar47[0x1b];
              x[0xcd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar32;
              x[0xcd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)pdVar47[0x1d];
              if ((u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows < 0x23) {
LAB_00160007:
                pcVar35 = 
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                ;
              }
              else {
                pdVar47 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data;
                pdVar32 = (double *)pdVar47[0x21];
                x[0x5d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)pdVar47[0x20];
                x[0x5e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar32;
                x[0x5e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)pdVar47[0x22];
                pdVar47 = x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
                pIVar5 = &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
                if (((double)pdVar47 != (double)*pIVar5) ||
                   (NAN((double)pdVar47) || NAN((double)*pIVar5))) {
                  pdVar47 = (double *)
                            x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows;
LAB_0015e537:
                  DVar8 = *(DenseStorage<double,__1,__1,_1,_0> *)
                           &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows;
                  x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                       = DVar8;
                  x[0x117].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = pdVar47;
                  dVar50 = (double)pdVar47 * (double)pdVar47 +
                           (double)DVar8.m_rows * (double)DVar8.m_rows +
                           (double)DVar8.m_data * (double)DVar8.m_data;
                  dVar52 = SQRT(dVar50);
                  if (9.999999999999999e-33 < dVar50) {
                    auVar48._8_8_ = dVar52;
                    auVar48._0_8_ = dVar52;
                    auVar48 = divpd((undefined1  [16])DVar8,auVar48);
                  }
                  else {
                    auVar48 = ZEXT816(0);
                  }
                  dVar49 = auVar48._8_8_;
                  if (9.999999999999999e-33 < dVar50) {
                    local_2a8 = (double)pdVar47 / dVar52;
                  }
                  else {
                    local_2a8 = 1.0;
                  }
                  dVar52 = (double)(-(ulong)(9.999999999999999e-33 < dVar50) & (ulong)dVar52);
                  dVar50 = sin(dVar52);
                  local_2c8 = auVar48._0_8_;
                  dVar11 = cos(dVar52);
                  dVar51 = 1.0 - dVar11;
                  dVar54 = dVar51 * local_2c8;
                  dVar52 = dVar51 * local_2a8 * local_2a8 + dVar11;
                  x[0x111].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)(dVar11 + dVar54 * local_2c8);
                  x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)(dVar50 * local_2a8 + dVar54 * dVar49);
                  x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)(local_2a8 * dVar54 - dVar50 * dVar49);
                  x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)(dVar54 * dVar49 - dVar50 * local_2a8);
                  dVar14 = dVar51 * dVar49 * local_2a8;
                  dVar12 = dVar50 * local_2c8 + dVar14;
                  auVar9._8_4_ = SUB84(dVar12,0);
                  auVar9._0_8_ = dVar11 + dVar51 * dVar49 * dVar49;
                  auVar9._12_4_ = (int)((ulong)dVar12 >> 0x20);
                  *(undefined1 (*) [16])
                   &x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows = auVar9;
                  x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)(dVar50 * dVar49 + local_2a8 * dVar54);
                  x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)(dVar14 - dVar50 * local_2c8);
                  x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)dVar52;
                }
                else {
                  dVar52 = (double)x[0x116].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                  pdVar47 = (double *)
                            x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows;
                  if ((((dVar52 != (double)x[0x4f].
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data) ||
                       (NAN(dVar52) ||
                        NAN((double)x[0x4f].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data))) ||
                      (pdVar32 = x[0x117].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data, (double)pdVar32 != (double)pdVar47)) ||
                     (NAN((double)pdVar32) || NAN((double)pdVar47))) goto LAB_0015e537;
                  dVar52 = (double)x[0x115].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                }
                pdVar47 = x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
                IVar21 = x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
                pdVar32 = x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
                IVar22 = x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
                pdVar31 = x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
                IVar23 = x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
                pdVar15 = x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
                x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = x[0x111].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
                x[0x55].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar47;
                x[0x55].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = IVar21;
                x[0x56].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar32;
                x[0x56].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = IVar22;
                x[0x57].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar31;
                x[0x57].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = IVar23;
                x[0x58].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar15;
                x[0x58].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)dVar52;
                if (0xe < plVar30[1]) {
                  lVar33 = *plVar30;
                  local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[0] = *(double *)(lVar33 + 0x48);
                  local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[1] = *(double *)(lVar33 + 0x50);
                  local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[2] = *(double *)(lVar33 + 0x58);
                  local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[3] = *(double *)(lVar33 + 0x60);
                  local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4] = *(double *)(lVar33 + 0x68);
                  local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[5] = *(double *)(lVar33 + 0x70);
                  kine::computeInertiaTensor(&tmp,&local_68,(Matrix3 *)(x + 0xb8));
                  if (0x17 < plVar30[1]) {
                    lVar33 = *plVar30;
                    local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[0] = *(double *)(lVar33 + 0x90);
                    local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[1] = *(double *)(lVar33 + 0x98);
                    local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[2] = *(double *)(lVar33 + 0xa0);
                    local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[3] = *(double *)(lVar33 + 0xa8);
                    local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[4] = *(double *)(lVar33 + 0xb0);
                    local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array[5] = *(double *)(lVar33 + 0xb8);
                    pIVar5 = &x[0xbc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows;
                    kine::computeInertiaTensor(&tmp,&local_98,(Matrix3 *)pIVar5);
                    uVar41 = (ulong)*(uint *)((long)&x[0x13].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4);
                    if (uVar41 != 0) {
                      uVar34 = 0x33;
                      uVar45 = 0;
                      do {
                        uVar39 = (ulong)((int)uVar34 - 3);
                        if (plVar30[1] + -3 < (long)uVar39) goto LAB_00160007;
                        lVar33 = *plVar30;
                        tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[0] = 0.0;
                        tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[1] = 0.0;
                        tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[2] = 0.0;
                        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                  ((DenseStorage<double,__1,__1,__1,_0> *)&tmp,3,3,1);
                        if (((tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[1] != 1.48219693752374e-323) ||
                            (tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[2] != 4.94065645841247e-324)) &&
                           ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                       ((DenseStorage<double,__1,__1,__1,_0> *)&tmp,3,3,1),
                            tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[1] != 1.48219693752374e-323 ||
                            (tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[2] != 4.94065645841247e-324)))) {
LAB_0016006d:
                          pcVar35 = 
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>, T1 = double, T2 = double]"
                          ;
                          goto LAB_00160082;
                        }
                        puVar3 = (undefined8 *)(lVar33 + uVar39 * 8);
                        uVar20 = puVar3[1];
                        *(undefined8 *)
                         tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[0] = *puVar3;
                        *(undefined8 *)
                         ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0] + 8) = uVar20;
                        *(undefined8 *)
                         ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0] + 0x10) =
                             *(undefined8 *)(lVar33 + 0x10 + uVar39 * 8);
                        pdVar47 = x[0xa7].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data;
                        lVar37 = (x[0xa5].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows -
                                  (long)x[0xa6].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data >> 3) * -0x5555555555555555 +
                                 (((long)pdVar47 -
                                   (long)x[0xa5].
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data >> 3) + -1 +
                                 (ulong)(pdVar47 == (double *)0x0)) * 0x15;
                        lVar33 = x[0xa4].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows -
                                 x[0xa3].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows >> 3;
                        lVar38 = lVar33 * -0x5555555555555555 + lVar37;
                        iVar44 = (int)uVar45;
                        if (lVar38 == 0) {
LAB_0015e96d:
                          if (lVar37 == lVar33 * 0x5555555555555555) {
                            *(int *)&x[0xa2].
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data = iVar44;
                          }
                          std::
                          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                          ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&x[0xa2].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows,(value_type *)&tmp);
                        }
                        else {
                          uVar27 = *(uint *)&x[0xa2].
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             .m_storage.m_data;
                          uVar39 = lVar38 + (ulong)uVar27;
                          if ((uVar45 < uVar27) || (uVar39 <= uVar45)) {
                            if (uVar45 != uVar39) goto LAB_0016008e;
                            goto LAB_0015e96d;
                          }
                          pMVar28 = std::
                                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                                    ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                                  *)&x[0xa3].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,(ulong)(iVar44 - uVar27));
                          Eigen::internal::
                          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                                    (pMVar28,(Matrix<double,__1,__1,_0,__1,__1> *)&tmp,
                                     (assign_op<double,_double> *)&local_128);
                        }
                        free((void *)tmp.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[0]);
                        if (plVar30[1] + -3 < (long)uVar34) goto LAB_00160007;
                        lVar33 = *plVar30;
                        tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[0] = 0.0;
                        tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[1] = 0.0;
                        tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[2] = 0.0;
                        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                  ((DenseStorage<double,__1,__1,__1,_0> *)&tmp,3,3,1);
                        if (((tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[1] != 1.48219693752374e-323) ||
                            (tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[2] != 4.94065645841247e-324)) &&
                           ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                       ((DenseStorage<double,__1,__1,__1,_0> *)&tmp,3,3,1),
                            tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[1] != 1.48219693752374e-323 ||
                            (tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[2] != 4.94065645841247e-324))))
                        goto LAB_0016006d;
                        puVar3 = (undefined8 *)(lVar33 + uVar34 * 8);
                        uVar20 = puVar3[1];
                        *(undefined8 *)
                         tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[0] = *puVar3;
                        *(undefined8 *)
                         ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0] + 8) = uVar20;
                        *(undefined8 *)
                         ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0] + 0x10) =
                             *(undefined8 *)(lVar33 + 0x10 + uVar34 * 8);
                        lVar33 = x[0xac].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows;
                        lVar37 = ((long)x[0xab].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data -
                                  x[0xab].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows >> 3) * -0x5555555555555555 +
                                 ((lVar33 - x[0xaa].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows >> 3) + -1 + (ulong)(lVar33 == 0)) *
                                 0x15;
                        lVar33 = (long)x[0xaa].
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data -
                                 (long)x[0xa9].
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data >> 3;
                        lVar38 = lVar33 * -0x5555555555555555 + lVar37;
                        if (lVar38 == 0) {
LAB_0015eae6:
                          if (lVar37 == lVar33 * 0x5555555555555555) {
                            *(int *)&x[0xa7].
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows = iVar44;
                          }
                          std::
                          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                          ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)(x + 0xa8),(value_type *)&tmp);
                        }
                        else {
                          uVar27 = (uint)x[0xa7].
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_rows;
                          uVar39 = lVar38 + (ulong)uVar27;
                          if ((uVar45 < uVar27) || (uVar39 <= uVar45)) {
                            if (uVar45 != uVar39) {
LAB_0016008e:
                              __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                                            ,0xaa,
                                            "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const"
                                           );
                            }
                            goto LAB_0015eae6;
                          }
                          pMVar28 = std::
                                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                                    ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                                  *)(x + 0xa9),(ulong)(iVar44 - uVar27));
                          Eigen::internal::
                          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                                    (pMVar28,(Matrix<double,__1,__1,_0,__1,__1> *)&tmp,
                                     (assign_op<double,_double> *)&local_128);
                        }
                        free((void *)tmp.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[0]);
                        uVar45 = uVar45 + 1;
                        uVar34 = (ulong)((int)uVar34 + 0xc);
                      } while (uVar41 != uVar45);
                    }
                    if (2 < plVar30[1]) {
                      pdVar47 = (double *)*plVar30;
                      dVar50 = *pdVar47;
                      pdVar32 = (double *)pdVar47[1];
                      x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows = (Index)dVar50;
                      x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data = pdVar32;
                      dVar52 = pdVar47[2];
                      x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows = (Index)dVar52;
                      if (*(char *)((long)&x[0x43].
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_rows + 5) != '\0') {
                        dVar49 = (double)pdVar32 -
                                 (double)x[0x53].
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_rows;
                        auVar13._8_4_ = SUB84(dVar49,0);
                        auVar13._0_8_ =
                             dVar50 - (double)x[0x53].
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                              .m_storage.m_data;
                        auVar13._12_4_ = (int)((ulong)dVar49 >> 0x20);
                        *(undefined1 (*) [16])
                         &x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows = auVar13;
                        x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows =
                             (Index)(dVar52 - (double)x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                      }
                      if (5 < plVar30[1]) {
                        lVar33 = *plVar30;
                        IVar21 = *(Index *)(lVar33 + 0x20);
                        x[0x90].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data = *(double **)(lVar33 + 0x18);
                        x[0x90].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows = IVar21;
                        x[0x91].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data = *(double **)(lVar33 + 0x28);
                        if (8 < plVar30[1]) {
                          lVar33 = *plVar30;
                          pdVar47 = *(double **)(lVar33 + 0x38);
                          x[0x91].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows = *(Index *)(lVar33 + 0x30);
                          x[0x92].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data = pdVar47;
                          x[0x92].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows = *(Index *)(lVar33 + 0x40);
                          if (0x11 < plVar30[1]) {
                            lVar33 = *plVar30;
                            IVar21 = *(Index *)(lVar33 + 0x80);
                            x[0x93].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data = *(double **)(lVar33 + 0x78);
                            x[0x93].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows = IVar21;
                            x[0x94].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data = *(double **)(lVar33 + 0x88);
                            if (0x1a < plVar30[1]) {
                              lVar33 = *plVar30;
                              pdVar47 = *(double **)(lVar33 + 200);
                              x[0x94].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows = *(Index *)(lVar33 + 0xc0);
                              x[0x95].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_data = pdVar47;
                              x[0x95].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows = *(Index *)(lVar33 + 0xd0);
                              if (0x1d < plVar30[1]) {
                                lVar33 = *plVar30;
                                IVar21 = *(Index *)(lVar33 + 0xe0);
                                x[0x96].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data = *(double **)(lVar33 + 0xd8);
                                x[0x96].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows = IVar21;
                                x[0x97].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data = *(double **)(lVar33 + 0xe8);
                                if (0x23 < plVar30[1]) {
                                  lVar33 = *plVar30;
                                  pdVar47 = *(double **)(lVar33 + 0x110);
                                  x[0x97].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows = *(Index *)(lVar33 + 0x108);
                                  x[0x98].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data = pdVar47;
                                  x[0x98].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows = *(Index *)(lVar33 + 0x118);
                                  if (0x29 < plVar30[1]) {
                                    lVar33 = *plVar30;
                                    IVar21 = *(Index *)(lVar33 + 0x140);
                                    x[0x99].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data = *(double **)(lVar33 + 0x138);
                                    x[0x99].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_rows = IVar21;
                                    x[0x9a].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data = *(double **)(lVar33 + 0x148);
                                    if (0x20 < plVar30[1]) {
                                      lVar33 = *plVar30;
                                      DVar8 = *(DenseStorage<double,__1,__1,_1,_0> *)(lVar33 + 0xf0)
                                      ;
                                      pdVar32 = DVar8.m_data;
                                      dVar52 = (double)DVar8.m_rows;
                                      *(DenseStorage<double,__1,__1,_1,_0> *)
                                       &x[0x9a].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = DVar8;
                                      pdVar47 = *(double **)(lVar33 + 0x100);
                                      x[0x9b].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows = (Index)pdVar47;
                                      if (0x26 < plVar30[1]) {
                                        lVar33 = *plVar30;
                                        IVar21 = *(Index *)(lVar33 + 0x128);
                                        x[0x9c].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = *(double **)(lVar33 + 0x120);
                                        x[0x9c].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = IVar21;
                                        x[0x9d].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = *(double **)(lVar33 + 0x130);
                                        pdVar31 = x[0x11c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        if (((((double)pdVar31 != (double)pdVar32) ||
                                             (NAN((double)pdVar31) || NAN((double)pdVar32))) ||
                                            (dVar50 = (double)x[0x11c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows, dVar50 != dVar52)) ||
                                           (((NAN(dVar50) || NAN(dVar52) ||
                                             (pdVar31 = x[0x11d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data,
                                             (double)pdVar31 != (double)pdVar47)) ||
                                            (NAN((double)pdVar31) || NAN((double)pdVar47))))) {
                                          x[0x11c].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage = DVar8;
                                          x[0x11d].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data = pdVar47;
                                          dVar50 = (double)pdVar47 * (double)pdVar47 +
                                                   dVar52 * dVar52 +
                                                   (double)pdVar32 * (double)pdVar32;
                                          dVar52 = SQRT(dVar50);
                                          if (9.999999999999999e-33 < dVar50) {
                                            auVar46._8_8_ = dVar52;
                                            auVar46._0_8_ = dVar52;
                                            auVar48 = divpd((undefined1  [16])DVar8,auVar46);
                                          }
                                          else {
                                            auVar48 = ZEXT816(0);
                                          }
                                          dVar49 = auVar48._8_8_;
                                          if (9.999999999999999e-33 < dVar50) {
                                            local_2c8 = (double)pdVar47 / dVar52;
                                          }
                                          else {
                                            local_2c8 = 1.0;
                                          }
                                          dVar52 = (double)(-(ulong)(9.999999999999999e-33 < dVar50)
                                                           & (ulong)dVar52);
                                          dVar50 = sin(dVar52);
                                          local_2b8 = auVar48._0_8_;
                                          dVar11 = cos(dVar52);
                                          dVar51 = 1.0 - dVar11;
                                          dVar54 = dVar51 * (double)local_2b8;
                                          dVar52 = dVar51 * local_2c8 * local_2c8 + dVar11;
                                          x[0x117].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows =
                                               (Index)(dVar11 + dVar54 * (double)local_2b8);
                                          x[0x118].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data =
                                               (double *)(dVar50 * local_2c8 + dVar54 * dVar49);
                                          x[0x118].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows =
                                               (Index)(local_2c8 * dVar54 - dVar50 * dVar49);
                                          x[0x119].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data =
                                               (double *)(dVar54 * dVar49 - dVar50 * local_2c8);
                                          dVar14 = dVar51 * dVar49 * local_2c8;
                                          dVar12 = dVar50 * (double)local_2b8 + dVar14;
                                          auVar10._8_4_ = SUB84(dVar12,0);
                                          auVar10._0_8_ = dVar11 + dVar51 * dVar49 * dVar49;
                                          auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
                                          *(undefined1 (*) [16])
                                           &x[0x119].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows = auVar10;
                                          x[0x11a].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows =
                                               (Index)(dVar50 * dVar49 + local_2c8 * dVar54);
                                          x[0x11b].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data =
                                               (double *)(dVar14 - dVar50 * (double)local_2b8);
                                          x[0x11b].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows = (Index)dVar52;
                                        }
                                        else {
                                          dVar52 = (double)x[0x11b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                        }
                                        pdVar47 = x[0x118].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        IVar21 = x[0x118].
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_rows;
                                        pdVar32 = x[0x119].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        IVar22 = x[0x119].
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_rows;
                                        pdVar31 = x[0x11a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        IVar23 = x[0x11a].
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_rows;
                                        pdVar15 = x[0x11b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        x[0x9d].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             x[0x117].
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             .m_storage.m_rows;
                                        x[0x9e].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = pdVar47;
                                        x[0x9e].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = IVar21;
                                        x[0x9f].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = pdVar32;
                                        x[0x9f].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = IVar22;
                                        x[0xa0].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = pdVar31;
                                        x[0xa0].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = IVar23;
                                        x[0xa1].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = pdVar15;
                                        x[0xa1].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = (Index)dVar52;
                                        dVar50 = (double)x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                        pdVar32 = x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        dVar49 = (double)x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                        pdVar31 = x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        dVar11 = (double)x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                        dVar12 = (double)x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                        pdVar15 = x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        dVar52 = (double)x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                        pdVar47 = x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        lVar33 = 0;
                                        do {
                                          dVar54 = *(double *)
                                                    ((long)&x[0x9e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                          pdVar16 = (double *)
                                                    ((long)&x[0x9d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                          dVar14 = *pdVar16;
                                          dVar51 = pdVar16[1];
                                          *(double *)
                                           ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33) =
                                               dVar51 * (double)pdVar31 + dVar14 * dVar50 +
                                               dVar54 * dVar12;
                                          *(double *)
                                           ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33 + 8) =
                                               dVar51 * dVar11 + dVar14 * (double)pdVar32 +
                                               dVar54 * (double)pdVar15;
                                          *(double *)
                                           ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33 + 0x10) =
                                               (double)pdVar47 * dVar51 + dVar54 * dVar52 +
                                               dVar49 * dVar14;
                                          lVar33 = lVar33 + 0x18;
                                        } while (lVar33 != 0x48);
                                        x[0x86].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data =
                                             (double *)
                                             tmp.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[0];
                                        x[0x86].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1];
                                        x[0x87].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data =
                                             (double *)
                                             tmp.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[2];
                                        x[0x87].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3];
                                        x[0x88].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data =
                                             (double *)
                                             tmp.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[4];
                                        x[0x88].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[5];
                                        x[0x89].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data =
                                             (double *)
                                             tmp.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[6];
                                        x[0x89].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[7];
                                        x[0x8a].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data =
                                             (double *)
                                             tmp.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[8];
                                        pIVar2 = &x[0x15].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                        uVar41 = 0;
                                        bVar25 = true;
                                        do {
                                          bVar40 = bVar25;
                                          pdVar47 = x[0xc6].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          lVar33 = (x[0xc3].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows -
                                                  x[0xc2].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows >> 3) * -0x5555555555555555 +
                                                  (x[0xc4].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows -
                                                  (long)x[0xc5].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data >> 3) * -0x5555555555555555 +
                                                  (((long)pdVar47 -
                                                    (long)x[0xc4].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data >> 3) + -1 +
                                                  (ulong)(pdVar47 == (double *)0x0)) * 0x15;
                                          if (lVar33 == 0) {
LAB_0015ffaa:
                                            __assert_fail(
                                                  "checkIndex(time) && \"Error: Time out of range\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                                                  ,0x9b,
                                                  "void stateObservation::IndexedMatrixArray::check_(unsigned int) const"
                                                  );
                                          }
                                          uVar27 = *(uint *)&x[0xc1].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          if ((uVar41 < uVar27) ||
                                             (lVar33 + (ulong)uVar27 <= uVar41)) goto LAB_0015ffaa;
                                          pMVar28 = std::
                                                  _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                                                  ::operator[]((
                                                  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                                  *)pIVar1,(ulong)((int)uVar41 - uVar27));
                                          if (((pMVar28->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               ).m_storage.m_rows < 3) ||
                                             ((pMVar28->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                              ).m_storage.m_cols < 1)) {
LAB_0015ffcd:
                                            __assert_fail(
                                                  "startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                                                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85
                                                  ,
                                                  "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                                                  );
                                          }
                                          if ((long)x[0x15].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -3 < (long)(uVar41 * 3))
                                          goto LAB_0015ffee;
                                          pdVar32 = (pMVar28->
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  ).m_storage.m_data;
                                          lVar33 = x[0x14].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          dVar52 = pdVar32[1];
                                          pdVar47 = (double *)(lVar33 + uVar41 * 0x18);
                                          *pdVar47 = *pdVar32;
                                          pdVar47[1] = dVar52;
                                          *(double *)(lVar33 + 0x10 + uVar41 * 0x18) = pdVar32[2];
                                          pdVar47 = x[0xc6].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          lVar33 = (x[0xc3].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows -
                                                  x[0xc2].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows >> 3) * -0x5555555555555555 +
                                                  (x[0xc4].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows -
                                                  (long)x[0xc5].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data >> 3) * -0x5555555555555555 +
                                                  (((long)pdVar47 -
                                                    (long)x[0xc4].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data >> 3) + -1 +
                                                  (ulong)(pdVar47 == (double *)0x0)) * 0x15;
                                          if (lVar33 == 0) goto LAB_0015ffaa;
                                          uVar27 = *(uint *)&x[0xc1].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          if ((uVar41 < uVar27) ||
                                             (lVar33 + (ulong)uVar27 <= uVar41)) goto LAB_0015ffaa;
                                          pMVar28 = std::
                                                  _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                                                  ::operator[]((
                                                  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                                  *)pIVar1,(ulong)((int)uVar41 - uVar27));
                                          if (((pMVar28->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               ).m_storage.m_rows < 6) ||
                                             ((pMVar28->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                              ).m_storage.m_cols < 1)) goto LAB_0015ffcd;
                                          if ((long)x[0x16].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -3 < (long)(uVar41 * 3))
                                          goto LAB_0015ffee;
                                          pdVar32 = (pMVar28->
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  ).m_storage.m_data;
                                          lVar33 = *pIVar2;
                                          dVar52 = pdVar32[4];
                                          pdVar47 = (double *)(lVar33 + uVar41 * 0x18);
                                          *pdVar47 = pdVar32[3];
                                          pdVar47[1] = dVar52;
                                          *(double *)(lVar33 + 0x10 + uVar41 * 0x18) = pdVar32[5];
                                          uVar41 = 1;
                                          bVar25 = false;
                                        } while (bVar40);
                                        if (0x2c < plVar30[1]) {
                                          lVar33 = *plVar30;
                                          pdVar47 = *(double **)(lVar33 + 0x158);
                                          x[0xf0].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows = *(Index *)(lVar33 + 0x150);
                                          x[0xf1].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data = pdVar47;
                                          x[0xf1].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows = *(Index *)(lVar33 + 0x160);
                                          if (0x2f < plVar30[1]) {
                                            lVar33 = *plVar30;
                                            IVar21 = *(Index *)(lVar33 + 0x170);
                                            x[0xf2].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data = *(double **)(lVar33 + 0x168);
                                            x[0xf2].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows = IVar21;
                                            x[0xf3].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data = *(double **)(lVar33 + 0x178);
                                            (*(code *)(x->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data[10])
                                                      (x,&x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,x + 0x90,
                                                  &x[0x91].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,x + 0x93,
                                                  &x[0x94].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,(Matrix3 *)(x + 0xb8),pIVar5,
                                                  x + 0xa2,&x[0xa7].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,local_180,local_188,x + 0xce,
                                                  &x[0x4e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,
                                                  &x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,x + 0x50,
                                                  &x[0xcf].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,
                                                  &x[0x14].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,pIVar2,x + 0xcb,
                                                  &x[0xcc].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,
                                                  &x[0xf0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,x + 0xf2);
                                            pdStack_170 = x[0x51].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            local_150 = x[0x50].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            dStack_148 = (double)x[0x50].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            local_140 = -(double)local_150;
                                            lVar33 = 0;
                                            do {
                                              dVar52 = *(double *)
                                                        ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                              pdVar47 = (double *)
                                                        ((long)&x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                              dVar50 = *pdVar47;
                                              dVar49 = pdVar47[1];
                                              *(double *)
                                               ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33) =
                                                   dVar49 * (double)pdStack_170 * -2.0 +
                                                   dVar50 * 0.0 + dVar52 * (dStack_148 + dStack_148)
                                              ;
                                              *(double *)
                                               ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33 + 8) =
                                                   dVar49 * 0.0 +
                                                   dVar50 * ((double)pdStack_170 +
                                                            (double)pdStack_170) +
                                                   dVar52 * (local_140 + local_140);
                                              *(double *)
                                               ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33 + 0x10) =
                                                   (dVar52 * 0.0 +
                                                   dVar49 * ((double)local_150 + (double)local_150))
                                                   - dVar50 * (dStack_148 + dStack_148);
                                              lVar33 = lVar33 + 0x18;
                                            } while (lVar33 != 0x48);
                                            dVar49 = (double)x[0x97].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            pdVar32 = x[0x98].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            dVar11 = (double)x[0x98].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            dVar12 = (double)x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            pdVar31 = x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            pdVar15 = x[0x99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            DVar8 = x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage;
                                            dVar54 = (double)x[0x99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            pdVar16 = x[0x9a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            dVar14 = (double)x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            pdVar17 = x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            dVar51 = dVar14 * (double)pdVar16 +
                                                     dVar54 * (double)x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + (double)pdVar15 * dVar12 +
                                                  (double)x[0xce].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[6] * dVar11 +
                                                  (double)pdVar32 *
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] +
                                                  dVar49 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0];
                                            pdVar55 = (double *)
                                                      ((double)pdVar17 * (double)pdVar16 +
                                                       dVar54 * (double)x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  (double)pdVar15 * (double)pdVar31 +
                                                  (double)x[0xce].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[7] * dVar11 +
                                                  (double)pdVar32 *
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[4] +
                                                  dVar49 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1]);
                                            pdVar47 = x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            dVar52 = (double)x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            dVar50 = (double)x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            dVar54 = (double)pdVar16 * dVar52 +
                                                     dVar54 * (double)pdVar47 +
                                                     (double)pdVar15 * dVar50 +
                                                     (double)x[0xcf].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  dVar11 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[8] +
                                                  (double)pdVar32 *
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[5] +
                                                  dVar49 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2];
                                            x[0x8a].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows = (Index)dVar51;
                                            x[0x8b].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data = pdVar55;
                                            x[0x8b].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows = (Index)dVar54;
                                            pdVar32 = x[0xd0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            dVar11 = (double)x[0xd0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            dVar49 = (double)x[0xcf].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            local_178 = 0.0;
                                            local_168 = -dStack_148;
                                            local_160 = -(double)pdStack_170;
                                            uStack_158 = 0;
                                            local_138[0] = 0.0;
                                            lVar33 = 0x10;
                                            do {
                                              dVar6 = *(double *)((long)&local_178 + lVar33);
                                              dVar53 = *(double *)((long)&local_188 + lVar33);
                                              dVar56 = *(double *)((long)&local_180 + lVar33);
                                              *(double *)((long)local_138 + lVar33) =
                                                   dVar56 * -(double)pdStack_170 + dVar53 * 0.0 +
                                                   dVar6 * dStack_148;
                                              *(double *)((long)local_138 + lVar33 + 8) =
                                                   dVar56 * 0.0 + dVar53 * (double)pdStack_170 +
                                                   dVar6 * local_140;
                                              *(double *)((long)&local_128 + lVar33) =
                                                   (dVar6 * 0.0 + dVar56 * (double)local_150) -
                                                   dVar53 * dStack_148;
                                              lVar33 = lVar33 + 0x18;
                                            } while (lVar33 != 0x58);
                                            dVar56 = local_128 + 0.0;
                                            dVar6 = local_118 - (double)pdVar32;
                                            dStack_110 = dStack_110 - dVar11;
                                            dVar53 = dVar49 + dStack_100;
                                            local_d8._8_4_ = SUB84(dStack_110,0);
                                            local_d8._0_8_ = dVar6;
                                            local_d8._12_4_ = (int)((ulong)dStack_110 >> 0x20);
                                            uVar20 = local_d8._8_8_;
                                            lVar33 = 0;
                                            local_c8 = local_108 + 0.0;
                                            dStack_c0 = dVar53;
                                            do {
                                              dVar7 = *(double *)
                                                       ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                              pdVar15 = (double *)
                                                        ((long)&x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                              dVar18 = *pdVar15;
                                              dVar19 = pdVar15[1];
                                              *(double *)
                                               ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33) =
                                                   dVar19 * (double)uVar20 + dVar18 * dVar56 +
                                                   dVar7 * ((double)pdVar32 + local_f8);
                                              *(double *)
                                               ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33 + 8) =
                                                   dVar19 * (local_108 + 0.0) +
                                                   dVar18 * (dVar11 + dStack_120) +
                                                   dVar7 * (-dVar49 + dStack_f0);
                                              *(double *)
                                               ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar33 + 0x10) =
                                                   dVar53 * dVar19 + dVar7 * (local_e8 + 0.0) +
                                                   dVar6 * dVar18;
                                              lVar33 = lVar33 + 0x18;
                                            } while (lVar33 != 0x48);
                                            pdVar32 = x[0x96].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            dVar49 = (double)x[0x96].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            pdVar15 = x[0x97].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            x[0x8a].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows =
                                                 (Index)(dVar51 + tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[6] * (double)pdVar15 +
                                                  dVar49 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] +
                                                  (double)pdVar32 *
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0]);
                                            x[0x8b].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data =
                                                 (double *)
                                                 ((double)pdVar55 +
                                                 tmp.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[7] * (double)pdVar15 +
                                                 dVar49 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[4] +
                                                 (double)pdVar32 *
                                                 tmp.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[1]);
                                            x[0x8b].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows =
                                                 (Index)(dVar54 + (double)pdVar15 *
                                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[8] +
                                                  dVar49 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[5] +
                                                  (double)pdVar32 *
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2]);
                                            pdVar15 = x[0x9c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            dVar11 = (double)x[0x9c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            pdVar16 = x[0x9d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            local_2b8 = DVar8.m_data;
                                            dStack_2b0 = (double)DVar8.m_rows;
                                            dVar49 = (double)pdVar17 * (double)pdVar16 +
                                                     dStack_2b0 * dVar11 +
                                                     (double)pdVar31 * (double)pdVar15 +
                                                     (double)x[0x50].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            pdVar32 = x[0x51].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            DVar8.m_rows._0_4_ = SUB84(dVar49,0);
                                            DVar8.m_data = (double *)
                                                           (dVar14 * (double)pdVar16 +
                                                            (double)local_2b8 * dVar11 +
                                                            dVar12 * (double)pdVar15 +
                                                           (double)x[0x50].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                                            DVar8.m_rows._4_4_ = (int)((ulong)dVar49 >> 0x20);
                                            x[0x8c].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage = DVar8;
                                            x[0x8d].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data =
                                                 (double *)
                                                 ((double)pdVar16 * dVar52 +
                                                  (double)pdVar47 * dVar11 +
                                                  dVar50 * (double)pdVar15 + (double)pdVar32);
                                            pIVar1 = &x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            this_00 = (AlgebraicSensor *)(x + 1);
                                            uVar27 = AlgebraicSensor::getStateSize(this_00);
                                            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                                                      ((DenseStorage<double,__1,__1,_1,_0> *)pIVar1,
                                                       (ulong)uVar27,(ulong)uVar27,1);
                                            if ((long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data < 9) {
                                              pcVar35 = 
                                              "Eigen::Block<Eigen::Matrix<double, -1, 1>, 9, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 9, BlockCols = 1, InnerPanel = false]"
                                              ;
                                            }
                                            else {
                                              puVar3 = (undefined8 *)
                                                       x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                              IVar21 = x[0x86].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                              *puVar3 = x[0x86].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                              puVar3[1] = IVar21;
                                              IVar21 = x[0x87].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                              puVar3[2] = x[0x87].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                              puVar3[3] = IVar21;
                                              IVar21 = x[0x88].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                              puVar3[4] = x[0x88].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                              puVar3[5] = IVar21;
                                              IVar21 = x[0x89].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                              puVar3[6] = x[0x89].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                              puVar3[7] = IVar21;
                                              puVar3[8] = x[0x8a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                              if (0xb < (long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data) {
                                                lVar33 = x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                pdVar47 = x[0x8b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                *(Index *)(lVar33 + 0x48) =
                                                     x[0x8a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                *(double **)(lVar33 + 0x50) = pdVar47;
                                                *(Index *)(lVar33 + 0x58) =
                                                     x[0x8b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                if (0xe < (long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data) {
                                                  lVar33 = x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  IVar21 = x[0x8c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  *(double **)(lVar33 + 0x60) =
                                                       x[0x8c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  *(Index *)(lVar33 + 0x68) = IVar21;
                                                  *(double **)(lVar33 + 0x70) =
                                                       x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  *(undefined4 *)
                                                   &x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data = 0xf;
                                                  if ((*(char *)((long)&x[0x43].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4) == '\x01') &&
                                                  (*(int *)((long)&x[0x13].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4) != 0)) {
                                                    uVar36 = 0xf;
                                                    uVar27 = 6;
                                                    uVar41 = 0;
                                                    do {
                                                      if ((u->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows + -6 <
                                                  (long)(ulong)((int)uVar41 * 6 + 0xc))
                                                  goto LAB_00160035;
                                                  if ((long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -6 < (long)(ulong)uVar36) {
                                                    pcVar35 = 
                                                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                                                  ;
                                                  goto LAB_00160061;
                                                  }
                                                  uVar39 = (ulong)(uVar27 & 0x7fffffff);
                                                  pdVar47 = (u->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data;
                                                  uVar45 = (ulong)uVar36 * 8 +
                                                           x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  uVar42 = (ulong)((uint)(uVar45 >> 3) & 1);
                                                  uVar34 = 6;
                                                  if ((uVar45 & 7) == 0) {
                                                    uVar34 = uVar42;
                                                  }
                                                  if (uVar34 != 0) {
                                                    uVar43 = 0;
                                                    do {
                                                      *(double *)(uVar45 + uVar43 * 8) =
                                                           pdVar47[uVar39 * 2 + uVar43];
                                                      uVar43 = uVar43 + 1;
                                                    } while (uVar34 != uVar43);
                                                  }
                                                  uVar34 = (6U - (int)uVar34 & 6) + uVar34;
                                                  if ((uVar45 & 7) == 0) {
                                                    do {
                                                      dVar52 = (pdVar47 + uVar39 * 2 + uVar42)[1];
                                                      pdVar32 = (double *)(uVar45 + uVar42 * 8);
                                                      *pdVar32 = pdVar47[uVar39 * 2 + uVar42];
                                                      pdVar32[1] = dVar52;
                                                      uVar42 = uVar42 + 2;
                                                    } while (uVar42 < uVar34);
                                                  }
                                                  if ((uint)uVar34 < 6) {
                                                    do {
                                                      *(double *)(uVar45 + uVar34 * 8) =
                                                           pdVar47[uVar39 * 2 + uVar34];
                                                      uVar34 = uVar34 + 1;
                                                    } while (uVar34 != 6);
                                                  }
                                                  uVar36 = *(int *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + 6;
                                                  *(uint *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data = uVar36;
                                                  uVar41 = uVar41 + 1;
                                                  uVar27 = uVar27 + 3;
                                                  } while (uVar41 < *(uint *)((long)&x[0x13].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4));
                                                  }
                                                  if (*(char *)((long)&x[0x43].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 6) != '\x01') {
LAB_0015fe8b:
                                                    AlgebraicSensor::setState
                                                              (this_00,(Vector *)pIVar1,in_R8D);
                                                    AlgebraicSensor::getMeasurements
                                                              ((AlgebraicSensor *)&tmp,
                                                               SUB81(this_00,0));
                                                    __ptr = (void *)x[0x1b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  x[0x1b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows =
                                                       (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0];
                                                  pdVar47 = x[0x1c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  x[0x1c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data =
                                                       (double *)
                                                       tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1];
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0] = (double)__ptr;
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1] = (double)pdVar47;
                                                  free(__ptr);
                                                  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::
                                                  DenseStorage((DenseStorage<double,__1,__1,_1,_0> *
                                                               )this,(
                                                  DenseStorage<double,__1,__1,_1,_0> *)
                                                  &x[0x1b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                  VVar57.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows = extraout_RDX;
                                                  VVar57.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data = (double *)this;
                                                  return (Vector)VVar57.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage;
                                                  }
                                                  pdVar47 = (double *)
                                                            cos((double)x[0x5e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                  x[0x65].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data = pdVar47;
                                                  local_128 = sin((double)x[0x5e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                  x[0x65].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows = (Index)local_128;
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0] =
                                                       (double)&x[0x60].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1] = 0.0;
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2] = 4.94065645841247e-324
                                                  ;
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] = 4.94065645841247e-324
                                                  ;
                                                  x[0x60].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows =
                                                       (Index)x[0x65].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  local_128 = -local_128;
                                                  pCVar29 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_((
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  *)&tmp,&local_128);
                                                  local_178 = 0.0;
                                                  pCVar29 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar29,&local_178);
                                                  pCVar29 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar29,(Scalar *)
                                                                      &x[0x65].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                  pCVar29 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar29,(Scalar *)(x + 0x65));
                                                  auVar24._8_8_ = 0;
                                                  auVar24._0_8_ = local_d8._8_8_;
                                                  local_d8 = auVar24 << 0x40;
                                                  pCVar29 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar29,(Scalar *)local_d8);
                                                  local_a0 = 0.0;
                                                  pCVar29 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar29,&local_a0);
                                                  local_a8 = 0.0;
                                                  pCVar29 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar29,&local_a8);
                                                  local_b0 = 1.0;
                                                  Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar29,&local_b0);
                                                  if (((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] +
                                                  (long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1] != 3) ||
                                                  (tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2] !=
                                                  1.48219693752374e-323)) {
                                                    pcVar35 = 
                                                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                                                  ;
LAB_00160224:
                                                  __assert_fail(
                                                  "((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                                                  ,
                                                  "/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h"
                                                  ,0x7c,pcVar35);
                                                  }
                                                  dVar50 = (double)x[0x60].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar32 = x[0x61].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  dVar49 = (double)x[0x61].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar31 = x[0x62].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  dVar11 = (double)x[0x62].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  dVar12 = (double)x[99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar15 = x[100].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  dVar52 = (double)x[100].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar47 = x[99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  lVar33 = 0;
                                                  do {
                                                    dVar54 = *(double *)
                                                              ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                                  pdVar16 = (double *)
                                                            ((long)&x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                                  dVar14 = *pdVar16;
                                                  dVar51 = pdVar16[1];
                                                  pdVar16 = (double *)
                                                            ((long)&x[0x79].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33);
                                                  *pdVar16 = dVar51 * (double)pdVar31 +
                                                             dVar14 * dVar50 + dVar54 * dVar12;
                                                  pdVar16[1] = dVar51 * dVar11 +
                                                               dVar14 * (double)pdVar32 +
                                                               dVar54 * (double)pdVar15;
                                                  *(double *)
                                                   ((long)&x[0x7a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar33) =
                                                       dVar51 * (double)pdVar47 + dVar54 * dVar52 +
                                                       dVar14 * dVar49;
                                                  lVar33 = lVar33 + 0x18;
                                                  } while (lVar33 != 0x48);
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0] = (double)(x + 0x7e);
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1] = 0.0;
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2] = 4.94065645841247e-324
                                                  ;
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] = 4.94065645841247e-324
                                                  ;
                                                  x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data =
                                                       (double *)
                                                       x[0x5d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  this_02 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  ::operator_((
                                                  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  *)&tmp,(Scalar *)(x + 0x5e));
                                                  local_128 = 0.0;
                                                  Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  ::operator_(this_02,&local_128);
                                                  if (((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] +
                                                  (long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1] != 3) ||
                                                  (tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2] !=
                                                  4.94065645841247e-324)) {
                                                    pcVar35 = 
                                                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                                                  ;
                                                  goto LAB_00160224;
                                                  }
                                                  pdVar47 = x[0x61].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  pdVar32 = x[0x4a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  dVar50 = (double)x[0x4a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar31 = x[0x4b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  dVar49 = (double)x[0x62].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar15 = x[100].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  dVar52 = (double)x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data =
                                                       (double *)
                                                       ((double)x[99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows * (double)pdVar31 +
                                                  dVar50 * (double)x[0x62].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  (double)pdVar32 *
                                                  (double)x[0x60].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  (double)x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                                                  x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows =
                                                       (Index)((double)pdVar15 * (double)pdVar31 +
                                                               dVar50 * dVar49 +
                                                               (double)pdVar32 * (double)pdVar47 +
                                                              dVar52);
                                                  x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data =
                                                       (double *)
                                                       ((double)pdVar31 *
                                                        (double)x[100].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  dVar50 * (double)x[99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  (double)pdVar32 *
                                                  (double)x[0x61].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  (double)x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                                                  Eigen::AngleAxis<double>::operator=
                                                            ((AngleAxis<double> *)
                                                             &x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,
                                                  (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                   *)&x[0x79].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                  pdVar47 = x[0x81].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  pdVar32 = x[0x80].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  x[0x81].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows =
                                                       (Index)((double)x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows * (double)pdVar47);
                                                  x[0x82].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data =
                                                       (double *)((double)pdVar32 * (double)pdVar47)
                                                  ;
                                                  x[0x82].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows =
                                                       (Index)((double)pdVar47 *
                                                              (double)x[0x80].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                  uVar41 = (ulong)*(uint *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  if ((long)uVar41 <=
                                                      (long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -3) {
                                                    lVar33 = x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  IVar21 = x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  puVar3 = (undefined8 *)(lVar33 + uVar41 * 8);
                                                  *puVar3 = x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  puVar3[1] = IVar21;
                                                  *(double **)(lVar33 + 0x10 + uVar41 * 8) =
                                                       x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  uVar41 = (ulong)(*(int *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + 3);
                                                  if ((long)uVar41 <=
                                                      (long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -3) {
                                                    lVar33 = x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar47 = x[0x82].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  pIVar5 = (Index *)(lVar33 + uVar41 * 8);
                                                  *pIVar5 = x[0x81].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pIVar5[1] = (Index)pdVar47;
                                                  *(Index *)(lVar33 + 0x10 + uVar41 * 8) =
                                                       x[0x82].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  goto LAB_0015fe8b;
                                                  }
                                                  }
                                                }
                                              }
LAB_0015ffee:
                                              pcVar35 = 
                                              "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                                              ;
                                            }
                                            goto LAB_00160061;
                                          }
                                        }
                                        goto LAB_00160007;
                                      }
                                    }
                                  }
                                }
                              }
                              goto LAB_00160035;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_00160007;
                  }
                }
                pcVar35 = 
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 6, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 6, BlockCols = 1, InnerPanel = false]"
                ;
              }
              goto LAB_00160061;
            }
          }
        }
      }
    }
  }
LAB_00160035:
  pcVar35 = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00160061:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,pcVar35);
}

Assistant:

Vector IMUElasticLocalFrameDynamicalSystem::measureDynamics
                (const Vector& x, const Vector& u, unsigned k)
    {
        assertStateVector_(x);
        assertInputVector_(u);

        xk_fory_=x;
        uk_fory_=u;
        op_.k_fory=k;

        op_.positionFlex=x.segment(state::pos,3);
        op_.velocityFlex=x.segment(state::linVel,3);
        op_.orientationFlexV=x.segment(state::ori,3);
        op_.angularVelocityFlex=x.segment(state::angVel,3);

        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
            op_.efforts[i]=x.segment(state::fc+6*i,6);

        op_.fm=x.segment(state::unmodeledForces,3);
        op_.tm=x.segment(state::unmodeledForces+3,3);
        op_.drift=x.segment<3>(state::drift);

        op_.rFlex =computeRotation_(op_.orientationFlexV,0);

        kine::computeInertiaTensor(u.segment<6>(input::inertia),op_.inertia);
        kine::computeInertiaTensor(u.segment<6>(input::dotInertia),op_.dotInertia);
        unsigned nbContacts(getContactsNumber());
        for (unsigned i = 0; i<nbContacts ; ++i)
        {
            // Positions
            op_.contactPosV.setValue(u.segment<3>(input::contacts + 12*i),i);
            op_.contactOriV.setValue(u.segment<3>(input::contacts +12*i+3),i);
        }
        op_.positionCom=u.segment<3>(input::posCom);
        if(withComBias_) op_.positionCom-=op_.positionComBias;
        op_.velocityCom=u.segment<3>(input::velCom);
        op_.accelerationCom=u.segment<3>(input::accCom);
        op_.AngMomentum=u.segment<3>(input::angMoment);
        op_.dotAngMomentum=u.segment<3>(input::dotAngMoment);

        op_.positionControl=u.segment(input::posIMU,3);
        op_.velocityControl=u.segment(input::linVelIMU,3);
        op_.accelerationControl=u.segment(input::linAccIMU,3);
        op_.orientationControlV=u.segment(input::oriIMU,3);
        op_.angularVelocityControl=u.segment(input::angVelIMU,3);

        op_.rControl=computeRotation_(op_.orientationControlV,1);

        op_.rimu = op_.rFlex * op_.rControl;

        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
        {
            fc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(0,0);
            tc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(3,0);
        }

        op_.addForce = u.segment<3>(input::additionalForces);
        op_.addMoment = u.segment<3>(input::additionalForces+3);

        // Get acceleration
        computeAccelerations (op_.positionCom, op_.velocityCom,
                  op_.accelerationCom, op_.AngMomentum, op_.dotAngMomentum,
                  op_.inertia, op_.dotInertia,  op_.contactPosV, op_.contactOriV,
                  op_.positionFlex, op_.velocityFlex, op_.linearAcceleration,
                  op_.orientationFlexV, op_.rFlex, op_.angularVelocityFlex,
                  op_.angularAcceleration, fc_, tc_, op_.fm,op_.tm,
                  op_.addForce,op_.addMoment);

        // Translation sensor dynamic
        op_.imuAcc = 2*kine::skewSymmetric(op_.angularVelocityFlex) * op_.rFlex * op_.velocityControl;
        op_.imuAcc += op_.linearAcceleration + op_.rFlex * op_.accelerationControl;
        op_.imuAcc += (
                    kine::skewSymmetric(op_.angularAcceleration)
                    + tools::square(kine::skewSymmetric(op_.angularVelocityFlex))
                )*op_.rFlex * op_.positionControl;

        // Rotation sensor dynamic
        op_.imuOmega = op_.angularVelocityFlex + op_.rFlex * op_.angularVelocityControl;

        // Set sensor state before measurement

        op_.sensorState.resize(sensor_.getStateSize());
        op_.sensorState.head<9>() = Eigen::Map<Eigen::Matrix<double, 9, 1> >(&op_.rimu(0,0));
        op_.sensorState.segment<3>(9)=op_.imuAcc;
        op_.sensorState.segment<3>(12)=op_.imuOmega;

        index_=15;

        if (withForceMeasurements_)
        {
          for (unsigned int i=0; i<nbContacts_; ++i)
          {
            op_.sensorState.segment(index_,6) = x.segment(state::fc+i*6,6);
            // the last part of the measurement is force torque, it is
            // computes by the current functor and not the sensor_.
            // (see AlgebraicSensor::concatenateWithInput
            // for more details
            index_+=6;
          }
        }

        if (withAbsolutePos_)
        {
          op_.cy=cos(op_.drift(2));
          op_.sy=sin(op_.drift(2));
          op_.rdrift<< op_.cy, -op_.sy, 0,
                       op_.sy,  op_.cy, 0,
                       0,       0,      1;
          op_.rtotal.noalias() = op_.rdrift*op_.rFlex;

          op_.ptotal << op_.drift(0),op_.drift(1),0;
          op_.ptotal.noalias() += op_.rdrift*op_.positionFlex;

          op_.aatotal = op_.rtotal;
          op_.oritotal.noalias() = op_.aatotal.angle()*op_.aatotal.axis();

          op_.sensorState.segment<3>(index_) = op_.ptotal;
          op_.sensorState.segment<3>(index_+3) = op_.oritotal;
        }

        sensor_.setState(op_.sensorState,k);

        //measurements
        yk_=sensor_.getMeasurements();
        return yk_;
    }